

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random_vector.hpp
# Opt level: O2

vector<signed_char,_std::allocator<signed_char>_> *
utility::random_vector<signed_char>
          (vector<signed_char,_std::allocator<signed_char>_> *__return_storage_ptr__,size_t size,
          char min,char max)

{
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  __first;
  anon_class_16_2_a39a3d48 __gen;
  uniform_int_distribution<signed_char> uniform;
  default_random_engine generator;
  allocator_type local_23;
  uniform_int_distribution<signed_char> local_22;
  default_random_engine local_20;
  
  std::vector<signed_char,_std::allocator<signed_char>_>::vector
            (__return_storage_ptr__,size,&local_23);
  local_20._M_x = 1;
  __first._M_current =
       (uchar *)(__return_storage_ptr__->
                super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
                super__Vector_impl_data._M_start;
  __gen.generator = &local_20;
  __gen.uniform = &local_22;
  local_22._M_param._M_a = min;
  local_22._M_param._M_b = max;
  std::
  generate_n<__gnu_cxx::__normal_iterator<signed_char*,std::vector<signed_char,std::allocator<signed_char>>>,unsigned_long,utility::random_vector<signed_char>(unsigned_long,signed_char,signed_char)::_lambda()_1_>
            (__first,(long)(__return_storage_ptr__->
                           super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
                           super__Vector_impl_data._M_finish - (long)__first._M_current,__gen);
  return __return_storage_ptr__;
}

Assistant:

std::vector<Integer> random_vector (std::size_t size, Integer min, Integer max)
    {
        std::vector<Integer> numbers(size);

        std::uniform_int_distribution<Integer> uniform(min, max);
        std::default_random_engine generator;

        std::generate_n(numbers.begin(), numbers.size(),
            [& uniform, & generator]
            {
                return uniform(generator);
            });

        return numbers;
    }